

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  byte bVar2;
  stbi_uc asVar3 [4];
  stbi_uc sVar4;
  uint x_00;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  byte *pbVar9;
  stbi_uc *psVar10;
  stbi_uc *psVar11;
  byte *pbVar12;
  char *pcVar13;
  uint uVar14;
  undefined7 uVar16;
  ulong uVar15;
  int iVar17;
  uchar *puVar18;
  long lVar19;
  char cVar20;
  undefined4 uVar21;
  undefined8 unaff_R13;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  long in_FS_OFFSET;
  bool bVar25;
  bool bVar26;
  uchar raw_data [4];
  stbi_uc local_70 [4];
  uint local_6c;
  undefined4 local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  stbi_uc *local_58;
  undefined8 local_50;
  undefined4 local_44;
  undefined8 local_40;
  undefined4 local_38;
  uint local_34;
  
  pbVar12 = s->img_buffer;
  if (pbVar12 < s->img_buffer_end) {
LAB_0015fc6c:
    s->img_buffer = pbVar12 + 1;
    local_40 = CONCAT44(local_40._4_4_,(uint)*pbVar12);
    pbVar12 = pbVar12 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar12 = s->img_buffer;
      goto LAB_0015fc6c;
    }
    local_40 = (ulong)local_40._4_4_ << 0x20;
    pbVar12 = (byte *)comp;
  }
  psVar10 = s->img_buffer;
  if (psVar10 < s->img_buffer_end) {
LAB_0015fca8:
    pbVar12 = psVar10 + 1;
    s->img_buffer = pbVar12;
    uVar21 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),*psVar10 != '\0');
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar10 = s->img_buffer;
      goto LAB_0015fca8;
    }
    uVar21 = 0;
  }
  psVar10 = s->img_buffer;
  if (psVar10 < s->img_buffer_end) {
LAB_0015fce4:
    pbVar12 = psVar10 + 1;
    s->img_buffer = pbVar12;
    local_60 = (uint)CONCAT71((int7)((ulong)psVar10 >> 8),*psVar10);
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar10 = s->img_buffer;
      goto LAB_0015fce4;
    }
    local_60 = 0;
  }
  local_6c = stbi__get16le(s);
  local_5c = stbi__get16le(s);
  pbVar9 = s->img_buffer;
  local_34 = req_comp;
  if (pbVar9 < s->img_buffer_end) {
LAB_0015fd3c:
    pbVar12 = pbVar9 + 1;
    s->img_buffer = pbVar12;
    uVar6 = (uint)*pbVar9;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar9 = s->img_buffer;
      goto LAB_0015fd3c;
    }
    uVar6 = 0;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  x_00 = stbi__get16le(s);
  iVar5 = stbi__get16le(s);
  local_50 = CONCAT44(extraout_var,iVar5);
  psVar10 = s->img_buffer;
  if (psVar10 < s->img_buffer_end) {
LAB_0015fd9d:
    pbVar12 = psVar10 + 1;
    s->img_buffer = pbVar12;
    local_64 = (uint)CONCAT71((int7)((ulong)psVar10 >> 8),*psVar10);
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar10 = s->img_buffer;
      goto LAB_0015fd9d;
    }
    local_64 = 0;
  }
  pbVar9 = s->img_buffer;
  if (pbVar9 < s->img_buffer_end) {
LAB_0015fdd8:
    pbVar12 = pbVar9 + 1;
    s->img_buffer = pbVar12;
    bVar26 = (*pbVar9 & 0x20) == 0;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar9 = s->img_buffer;
      goto LAB_0015fdd8;
    }
    bVar26 = true;
  }
  local_70[0] = '\0';
  local_70[1] = '\0';
  local_70[2] = '\0';
  local_70[3] = '\0';
  cVar20 = (char)uVar21;
  uVar16 = (undefined7)((ulong)pbVar12 >> 8);
  if (cVar20 == '\0') {
    uVar6 = local_64 & 0xff;
    uVar15 = CONCAT71(uVar16,1);
    local_68 = (undefined4)uVar15;
    if (uVar6 < 0x10) {
      if (uVar6 == 8) {
LAB_0015feec:
        uVar6 = 1;
        goto LAB_0015fef1;
      }
      if (uVar6 == 0xf) goto LAB_0015fe8e;
    }
    else {
      if ((uVar6 == 0x20) || (uVar6 == 0x18)) {
        uVar6 = local_64 >> 3 & 0x1f;
LAB_0015fef1:
        local_44 = 0;
        goto LAB_0015fef9;
      }
      if (uVar6 == 0x10) {
        uVar6 = (local_60 & 0xff) - 8;
        if ((byte)local_60 < 8) {
          uVar6 = local_60 & 0xff;
        }
        uVar15 = (ulong)uVar6;
        if (uVar6 != 3) goto LAB_0015fe8e;
        uVar6 = uVar6 == 3 ^ 3;
        local_44 = 0;
        goto LAB_0015fef9;
      }
    }
LAB_0015fef5:
    local_44 = 0;
    uVar6 = 0;
  }
  else {
    local_68 = (undefined4)CONCAT71(uVar16,1);
    if (0x17 < uVar6) {
      if ((uVar6 == 0x18) || (uVar6 == 0x20)) {
        uVar6 = uVar6 >> 3;
        goto LAB_0015fef1;
      }
      goto LAB_0015fef5;
    }
    uVar15 = (ulong)(uVar6 - 0xf);
    if (1 < uVar6 - 0xf) {
      if (uVar6 == 8) goto LAB_0015feec;
      goto LAB_0015fef5;
    }
LAB_0015fe8e:
    uVar6 = 3;
    local_44 = (undefined4)CONCAT71((int7)(uVar15 >> 8),1);
    local_68 = 0;
  }
LAB_0015fef9:
  if (uVar6 == 0) {
    pcVar13 = "Can\'t find out TGA pixelformat";
    goto LAB_00160389;
  }
  *x = x_00;
  iVar5 = (int)local_50;
  *y = iVar5;
  if (comp != (int *)0x0) {
    *comp = uVar6;
  }
  iVar7 = stbi__mad3sizes_valid(x_00,iVar5,uVar6,0);
  if (iVar7 != 0) {
    psVar10 = (stbi_uc *)stbi__malloc_mad3(x_00,iVar5,uVar6,0);
    if (psVar10 == (uchar *)0x0) {
LAB_00160382:
      pcVar13 = "Out of memory";
      goto LAB_00160389;
    }
    bVar25 = (byte)local_60 < 8;
    stbi__skip(s,(int)local_40);
    uVar8 = local_5c;
    if ((cVar20 == '\0' && (char)local_44 == '\0') && bVar25) {
      if (iVar5 != 0) {
        iVar5 = (int)local_50;
        iVar7 = 0;
        do {
          iVar5 = iVar5 + -1;
          iVar17 = iVar7;
          if (bVar26) {
            iVar17 = iVar5;
          }
          stbi__getn(s,psVar10 + (int)(iVar17 * uVar6 * x_00),uVar6 * x_00);
          iVar7 = iVar7 + 1;
        } while (iVar5 != 0);
      }
      goto LAB_001602ff;
    }
    local_38 = uVar21;
    if (cVar20 == '\0') {
      local_58 = (stbi_uc *)0x0;
    }
    else {
      if (local_5c == 0) {
LAB_0016036c:
        free(psVar10);
        goto LAB_00160371;
      }
      stbi__skip(s,local_6c);
      psVar11 = (stbi_uc *)stbi__malloc_mad2(uVar8,uVar6,0);
      if (psVar11 == (stbi_uc *)0x0) {
        free(psVar10);
        goto LAB_00160382;
      }
      local_58 = psVar11;
      if ((char)local_68 == '\0') {
        if (uVar6 != 3) {
          __assert_fail("tga_comp == STBI_rgb",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                        ,0x1691,
                        "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                       );
        }
        lVar19 = 0;
        do {
          uVar14 = stbi__get16le(s);
          psVar11[lVar19] = (stbi_uc)((ulong)((uVar14 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
          psVar11[lVar19 + 1] = (stbi_uc)((ulong)((uVar14 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
          psVar11[lVar19 + 2] = (stbi_uc)((ulong)((uVar14 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
          lVar19 = lVar19 + 3;
        } while (uVar8 * 3 != (int)lVar19);
        iVar5 = (int)local_50;
      }
      else {
        iVar7 = stbi__getn(s,psVar11,uVar6 * uVar8);
        if (iVar7 == 0) {
          free(psVar10);
          psVar10 = psVar11;
          goto LAB_0016036c;
        }
      }
    }
    if (iVar5 * x_00 != 0) {
      uVar15 = (ulong)(uVar6 + (uVar6 == 0));
      local_40 = (ulong)(iVar5 * x_00);
      uVar24 = 0;
      bVar2 = 0;
      local_6c = 0;
      iVar5 = 0;
      do {
        if ((byte)local_60 < 8) {
LAB_001600fa:
          bVar25 = false;
        }
        else {
          if (iVar5 == 0) {
            pbVar12 = s->img_buffer;
            if (pbVar12 < s->img_buffer_end) {
LAB_001600db:
              s->img_buffer = pbVar12 + 1;
              local_6c = (uint)*pbVar12;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar12 = s->img_buffer;
                goto LAB_001600db;
              }
              local_6c = 0;
            }
            iVar5 = (local_6c & 0x7f) + 1;
            local_6c = local_6c >> 7;
            goto LAB_001600fa;
          }
          bVar25 = (bool)(bVar2 & local_6c != 0);
          local_6c = (uint)(local_6c != 0);
        }
        uVar8 = local_5c;
        if (!bVar25) {
          if ((char)local_38 == '\0') {
            if ((char)local_68 == '\0') {
              if (uVar6 != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                              ,0x16c2,
                              "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                             );
              }
              uVar8 = stbi__get16le(s);
              asVar3 = local_70;
              local_70[1] = (char)((ulong)((uVar8 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
              local_70[0] = (char)((ulong)((uVar8 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
              local_70[3] = asVar3[3];
              local_70[2] = (char)((ulong)((uVar8 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
            }
            else {
              uVar22 = 0;
              do {
                psVar11 = s->img_buffer;
                if (psVar11 < s->img_buffer_end) {
LAB_00160185:
                  s->img_buffer = psVar11 + 1;
                  sVar4 = *psVar11;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar11 = s->img_buffer;
                    goto LAB_00160185;
                  }
                  sVar4 = '\0';
                }
                local_70[uVar22] = sVar4;
                uVar22 = uVar22 + 1;
              } while (uVar15 != uVar22);
            }
          }
          else {
            if ((char)local_64 == '\b') {
              pbVar12 = s->img_buffer;
              if (s->img_buffer_end <= pbVar12) {
                if (s->read_from_callbacks == 0) {
                  uVar14 = 0;
                  goto LAB_001601b7;
                }
                stbi__refill_buffer(s);
                pbVar12 = s->img_buffer;
              }
              s->img_buffer = pbVar12 + 1;
              uVar14 = (uint)*pbVar12;
            }
            else {
              uVar14 = stbi__get16le(s);
              uVar8 = local_5c;
            }
LAB_001601b7:
            if (uVar8 <= uVar14) {
              uVar14 = 0;
            }
            memcpy(local_70,local_58 + uVar14 * uVar6,uVar15);
          }
        }
        memcpy(psVar10 + uVar6 * (int)uVar24,local_70,uVar15);
        iVar5 = iVar5 + -1;
        uVar24 = uVar24 + 1;
        bVar2 = 1;
      } while (uVar24 != local_40);
    }
    if (bVar26 && (int)local_50 != 0) {
      iVar5 = uVar6 * x_00;
      uVar14 = (int)local_50 - 1;
      iVar7 = iVar5 * uVar14;
      uVar23 = 0;
      uVar8 = 0;
      do {
        if (iVar5 != 0) {
          puVar18 = psVar10;
          iVar17 = iVar5 + 1;
          do {
            uVar1 = puVar18[uVar23];
            puVar18[uVar23] = puVar18[iVar7];
            puVar18[iVar7] = uVar1;
            puVar18 = puVar18 + 1;
            iVar17 = iVar17 + -1;
          } while (1 < iVar17);
        }
        iVar7 = iVar7 - iVar5;
        uVar23 = uVar23 + iVar5;
        bVar26 = uVar8 != uVar14 >> 1;
        uVar8 = uVar8 + 1;
      } while (bVar26);
    }
    if (local_58 != (stbi_uc *)0x0) {
      free(local_58);
    }
LAB_001602ff:
    if (((char)local_44 == '\0' && 2 < uVar6) && (iVar5 = (uint)local_50 * x_00, iVar5 != 0)) {
      puVar18 = psVar10 + 2;
      do {
        uVar1 = puVar18[-2];
        puVar18[-2] = *puVar18;
        *puVar18 = uVar1;
        puVar18 = puVar18 + uVar6;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    if (local_34 == 0) {
      return psVar10;
    }
    if (uVar6 == local_34) {
      return psVar10;
    }
    puVar18 = stbi__convert_format(psVar10,uVar6,local_34,x_00,(uint)local_50);
    return puVar18;
  }
LAB_00160371:
  pcVar13 = "Corrupt TGA";
LAB_00160389:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar13;
  return (void *)0x0;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   if (tga_height > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (tga_width > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         if (tga_palette_len == 0) {  /* you have to have at least one entry! */
            STBI_FREE(tga_data);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }

         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}